

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void addLengthDistance(uivector *values,size_t length,size_t distance)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  uivector *in_RDX;
  size_t in_RSI;
  long *in_RDI;
  uint ok;
  size_t pos;
  uint extra_distance;
  uint dist_code;
  uint extra_length;
  uint length_code;
  
  sVar6 = searchCodeIndex(LENGTHBASE,0x1d,in_RSI);
  iVar3 = (int)sVar6;
  iVar4 = (int)in_RSI - LENGTHBASE[sVar6 & 0xffffffff];
  sVar6 = searchCodeIndex(DISTANCEBASE,0x1e,(size_t)in_RDX);
  uVar1 = DISTANCEBASE[sVar6 & 0xffffffff];
  lVar2 = in_RDI[1];
  uVar5 = uivector_resize(in_RDX,CONCAT44(iVar3,iVar4));
  if (uVar5 != 0) {
    *(int *)(*in_RDI + lVar2 * 4) = iVar3 + 0x101;
    *(int *)(*in_RDI + 4 + lVar2 * 4) = iVar4;
    *(int *)(*in_RDI + 8 + lVar2 * 4) = (int)sVar6;
    *(uint *)(*in_RDI + 0xc + lVar2 * 4) = (int)in_RDX - uVar1;
  }
  return;
}

Assistant:

static void addLengthDistance(uivector* values, size_t length, size_t distance) {
  /*values in encoded vector are those used by deflate:
  0-255: literal bytes
  256: end
  257-285: length/distance pair (length code, followed by extra length bits, distance code, extra distance bits)
  286-287: invalid*/

  unsigned length_code = (unsigned)searchCodeIndex(LENGTHBASE, 29, length);
  unsigned extra_length = (unsigned)(length - LENGTHBASE[length_code]);
  unsigned dist_code = (unsigned)searchCodeIndex(DISTANCEBASE, 30, distance);
  unsigned extra_distance = (unsigned)(distance - DISTANCEBASE[dist_code]);

  size_t pos = values->size;
  /*TODO: return error when this fails (out of memory)*/
  unsigned ok = uivector_resize(values, values->size + 4);
  if(ok) {
    values->data[pos + 0] = length_code + FIRST_LENGTH_CODE_INDEX;
    values->data[pos + 1] = extra_length;
    values->data[pos + 2] = dist_code;
    values->data[pos + 3] = extra_distance;
  }
}